

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_row.c
# Opt level: O0

void PickleRows_delete(PickleRows *pickle_rows)

{
  wchar_t local_14;
  wchar_t i;
  PickleRows *pickle_rows_local;
  
  if (pickle_rows != (PickleRows *)0x0) {
    if (pickle_rows->pickle_rows != (PickleRow *)0x0) {
      for (local_14 = L'\0'; local_14 < pickle_rows->row_count; local_14 = local_14 + L'\x01') {
        delete_pickle_row_content(pickle_rows->pickle_rows + local_14);
      }
      free(pickle_rows->pickle_rows);
    }
    free(pickle_rows);
  }
  return;
}

Assistant:

void PickleRows_delete(const PickleRows* pickle_rows) {
    if (!pickle_rows) {
        return;
    }
    if (pickle_rows->pickle_rows) {
        int i;
        for(i = 0; i < pickle_rows->row_count; ++i) {
            delete_pickle_row_content(pickle_rows->pickle_rows + i);
        }
        free((void*)pickle_rows->pickle_rows);
    }
    free((void*)pickle_rows);
}